

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O2

bool __thiscall
OSSLRSA::reconstructParameters
          (OSSLRSA *this,AsymmetricParameters **ppParams,ByteString *serialisedData)

{
  int iVar1;
  size_t sVar2;
  RSAParameters *this_00;
  
  if ((ppParams != (AsymmetricParameters **)0x0) &&
     (sVar2 = ByteString::size(serialisedData), sVar2 != 0)) {
    this_00 = (RSAParameters *)operator_new(0x38);
    RSAParameters::RSAParameters(this_00);
    iVar1 = (*(this_00->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[4])
                      (this_00,serialisedData);
    if ((char)iVar1 != '\0') {
      *ppParams = (AsymmetricParameters *)this_00;
      return true;
    }
    (*(this_00->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[2])(this_00);
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructParameters(AsymmetricParameters** ppParams, ByteString& serialisedData)
{
	// Check input parameters
	if ((ppParams == NULL) || (serialisedData.size() == 0))
	{
		return false;
	}

	RSAParameters* params = new RSAParameters();

	if (!params->deserialise(serialisedData))
	{
		delete params;

		return false;
	}

	*ppParams = params;

	return true;
}